

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getLeaveVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *leaveMax,SPxId enterId,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterBound,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newUBbound,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newLBbound,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newCoPrhs,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  pointer pnVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int32_t iVar24;
  int iVar25;
  Status SVar26;
  Status *pSVar27;
  pointer pnVar28;
  ostream *poVar29;
  undefined8 *puVar30;
  long lVar31;
  long lVar32;
  cpp_dec_float<50U,_int,_void> *pcVar33;
  long lVar34;
  cpp_dec_float<50U,_int,_void> *pcVar35;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> local_c8;
  cpp_dec_float<50U,_int,_void> local_88;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  this_00 = &this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_50 = enterId.super_DataKey;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&enterBound->m_backend,0);
  pcVar33 = &newCoPrhs->m_backend;
  if (-1 < enterId.super_DataKey.info) {
    SPxColId::SPxColId((SPxColId *)&local_108,(SPxId *)&local_50);
    iVar25 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_108);
    lVar32 = (long)iVar25;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.colstat.data[lVar32]) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      uStack_40 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,local_48);
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
      (newUBbound->m_backend).exp = local_108.exp;
      (newUBbound->m_backend).neg = local_108.neg;
      (newUBbound->m_backend).fpclass = local_108.fpclass;
      (newUBbound->m_backend).prec_elem = local_108.prec_elem;
      ::soplex::infinity::__tls_init();
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,-local_48);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
           CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
      (newLBbound->m_backend).exp = local_108.exp;
      (newLBbound->m_backend).neg = local_108.neg;
      (newLBbound->m_backend).fpclass = local_108.fpclass;
      (newLBbound->m_backend).prec_elem = local_108.prec_elem;
      pnVar28 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar24;
      pSVar27 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
      goto LAB_0024132d;
    case D_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newUBbound->m_backend,0);
      ::soplex::infinity::__tls_init();
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
           CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
      (newLBbound->m_backend).exp = local_108.exp;
      (newLBbound->m_backend).neg = local_108.neg;
      (newLBbound->m_backend).fpclass = local_108.fpclass;
      (newLBbound->m_backend).prec_elem = local_108.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar32] = P_ON_LOWER;
      pnVar28 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_00240683:
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
LAB_0024085e:
      (newCoPrhs->m_backend).exp = *(int *)((long)(pnVar28 + lVar32) + 0x28);
      (newCoPrhs->m_backend).neg = *(bool *)((long)(pnVar28 + lVar32) + 0x2c);
      uVar13 = *(undefined8 *)((long)(pnVar28 + lVar32) + 0x30);
      (newCoPrhs->m_backend).fpclass = (int)uVar13;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
      return;
    case D_ON_LOWER:
      ::soplex::infinity::__tls_init();
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
      (newUBbound->m_backend).exp = local_108.exp;
      (newUBbound->m_backend).neg = local_108.neg;
      (newUBbound->m_backend).fpclass = local_108.fpclass;
      (newUBbound->m_backend).prec_elem = local_108.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar32] = P_ON_UPPER;
      pnVar28 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_00240839:
      uVar13 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems =
           *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      goto LAB_0024085e;
    case D_ON_BOTH:
      pnVar28 = (this->theCoPvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar34 = lVar32 * 0x38;
      local_88.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = pnVar28[lVar32].m_backend.exp;
      local_88.neg = pnVar28[lVar32].m_backend.neg;
      local_88.fpclass = pnVar28[lVar32].m_backend.fpclass;
      local_88.prec_elem = pnVar28[lVar32].m_backend.prec_elem;
      local_c8.fpclass = cpp_dec_float_finite;
      local_c8.prec_elem = 10;
      local_c8.data._M_elems[0] = 0;
      local_c8.data._M_elems[1] = 0;
      local_c8.data._M_elems[2] = 0;
      local_c8.data._M_elems[3] = 0;
      local_c8.data._M_elems[4] = 0;
      local_c8.data._M_elems[5] = 0;
      local_c8.data._M_elems._24_5_ = 0;
      local_c8.data._M_elems[7]._1_3_ = 0;
      local_c8.data._M_elems._32_5_ = 0;
      local_c8.data._M_elems[9]._1_3_ = 0;
      local_c8.exp = 0;
      local_c8.neg = false;
      if (&local_c8 != &leaveMax->m_backend) {
        uVar13 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 8);
        local_c8.data._M_elems._32_5_ = SUB85(uVar13,0);
        local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
        local_c8.data._M_elems._0_8_ = *(undefined8 *)(leaveMax->m_backend).data._M_elems;
        local_c8.data._M_elems._8_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 2);
        local_c8.data._M_elems._16_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 4);
        uVar13 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 6);
        local_c8.data._M_elems._24_5_ = SUB85(uVar13,0);
        local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
        local_c8.exp = (leaveMax->m_backend).exp;
        local_c8.neg = (leaveMax->m_backend).neg;
        local_c8.fpclass = (leaveMax->m_backend).fpclass;
        local_c8.prec_elem = (leaveMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_c8,&local_88);
      if (local_c8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_108,0,(type *)0x0);
        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_c8,&local_108);
        if (iVar25 < 0) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&newUBbound->m_backend,0);
          ::soplex::infinity::__tls_init();
          local_108.fpclass = cpp_dec_float_finite;
          local_108.prec_elem = 10;
          local_108.data._M_elems[0] = 0;
          local_108.data._M_elems[1] = 0;
          local_108.data._M_elems[2] = 0;
          local_108.data._M_elems[3] = 0;
          local_108.data._M_elems[4] = 0;
          local_108.data._M_elems[5] = 0;
          local_108.data._M_elems._24_5_ = 0;
          local_108.data._M_elems[7]._1_3_ = 0;
          local_108.data._M_elems[8] = 0;
          local_108.data._M_elems[9] = 0;
          local_108.exp = 0;
          local_108.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_108,-*(double *)(in_FS_OFFSET + -8));
          *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_
          ;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
               local_108.data._M_elems._16_8_;
          *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
               CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
               CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
          (newLBbound->m_backend).exp = local_108.exp;
          (newLBbound->m_backend).neg = local_108.neg;
          (newLBbound->m_backend).fpclass = local_108.fpclass;
          (newLBbound->m_backend).prec_elem = local_108.prec_elem;
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.colstat.data[lVar32] = P_ON_LOWER;
          pnVar28 = (this->theLCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_002415a7:
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
               *(undefined8 *)((long)&(pnVar28->m_backend).data + lVar34 + 0x20);
          puVar30 = (undefined8 *)((long)&(pnVar28->m_backend).data + lVar34);
          uVar13 = *puVar30;
          uVar21 = puVar30[1];
          puVar30 = (undefined8 *)((long)&(pnVar28->m_backend).data + lVar34 + 0x10);
          uVar22 = puVar30[1];
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *puVar30;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
          *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
          goto LAB_00240f36;
        }
      }
      ::soplex::infinity::__tls_init();
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
           CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
      (newUBbound->m_backend).exp = local_108.exp;
      (newUBbound->m_backend).neg = local_108.neg;
      (newUBbound->m_backend).fpclass = local_108.fpclass;
      (newUBbound->m_backend).prec_elem = local_108.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar32] = P_ON_UPPER;
      pnVar28 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_00240f13:
      puVar30 = (undefined8 *)((long)&(pnVar28->m_backend).data + lVar34);
      uVar13 = puVar30[1];
      puVar3 = (undefined8 *)((long)&(pnVar28->m_backend).data + lVar34 + 0x10);
      uVar21 = *puVar3;
      uVar22 = puVar3[1];
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = *puVar30;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&(pnVar28->m_backend).data + lVar34 + 0x20);
LAB_00240f36:
      (newCoPrhs->m_backend).exp = *(int *)((long)&(pnVar28->m_backend).data + lVar34 + 0x28);
      (newCoPrhs->m_backend).neg = *(bool *)((long)&(pnVar28->m_backend).data + lVar34 + 0x2c);
      uVar13 = *(undefined8 *)((long)&(pnVar28->m_backend).data + lVar34 + 0x30);
      (newCoPrhs->m_backend).fpclass = (int)uVar13;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
      return;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE56 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR! Tried to put a fixed column variable into the basis. ",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar29 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar29,", lower=",8);
      poVar29 = boost::multiprecision::operator<<
                          (poVar29,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar29,", upper=",8);
      poVar29 = boost::multiprecision::operator<<
                          (poVar29,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar32);
      std::endl<char,std::char_traits<char>>(poVar29);
      puVar30 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_108.data._M_elems._0_8_ = local_108.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"XLEAVE07 This should never happen.","");
      *puVar30 = &PTR__SPxException_0069d438;
      puVar30[1] = puVar30 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar30 + 1),local_108.data._M_elems._0_8_,
                 local_108.data._M_elems._0_8_ + local_108.data._M_elems._8_8_);
      *puVar30 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar30,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar30 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_108.data._M_elems._0_8_ = local_108.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"XLEAVE08 This should never happen.","");
      *puVar30 = &PTR__SPxException_0069d438;
      puVar30[1] = puVar30 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar30 + 1),local_108.data._M_elems._0_8_,
                 local_108.data._M_elems._0_8_ + local_108.data._M_elems._8_8_);
      *puVar30 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar30,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar26 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar25);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar32] = SVar26;
      pcVar35 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend;
      ::soplex::infinity::__tls_init();
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,*(double *)(in_FS_OFFSET + -8));
      if (((pcVar35->fpclass != cpp_dec_float_NaN) && (local_108.fpclass != cpp_dec_float_NaN)) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar35,&local_108), iVar25 < 0)) {
        pnVar28 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar14 = (this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20) =
             *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 0x20);
        uVar13 = *(undefined8 *)&pnVar14[lVar32].m_backend.data;
        uVar21 = *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar14[lVar32].m_backend.data + 0x10);
        uVar22 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar22;
        *(undefined8 *)&pnVar28[lVar32].m_backend.data = uVar13;
        *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8) = uVar21;
        pnVar28[lVar32].m_backend.exp = pnVar14[lVar32].m_backend.exp;
        pnVar28[lVar32].m_backend.neg = pnVar14[lVar32].m_backend.neg;
        iVar24 = pnVar14[lVar32].m_backend.prec_elem;
        pnVar28[lVar32].m_backend.fpclass = pnVar14[lVar32].m_backend.fpclass;
        pnVar28[lVar32].m_backend.prec_elem = iVar24;
      }
      pnVar28 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar21;
      (newUBbound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar21;
      (newLBbound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      SVar26 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar25);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar32] = SVar26;
      pcVar35 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend;
      ::soplex::infinity::__tls_init();
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[8] = 0;
      local_108.data._M_elems[9] = 0;
      local_108.exp = 0;
      local_108.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_108,-*(double *)(in_FS_OFFSET + -8));
      if (((pcVar35->fpclass != cpp_dec_float_NaN) && (local_108.fpclass != cpp_dec_float_NaN)) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar35,&local_108), 0 < iVar25)) {
        pnVar28 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar14 = (this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 0x20) =
             *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
        uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
        uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
        uVar22 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar14[lVar32].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar22;
        *(undefined8 *)&pnVar14[lVar32].m_backend.data = uVar13;
        *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 8) = uVar21;
        pnVar14[lVar32].m_backend.exp = pnVar28[lVar32].m_backend.exp;
        pnVar14[lVar32].m_backend.neg = pnVar28[lVar32].m_backend.neg;
        iVar24 = pnVar28[lVar32].m_backend.prec_elem;
        pnVar14[lVar32].m_backend.fpclass = pnVar28[lVar32].m_backend.fpclass;
        pnVar14[lVar32].m_backend.prec_elem = iVar24;
      }
      pnVar28 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar21;
      (newUBbound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar21;
      (newLBbound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      SVar26 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar25);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar32] = SVar26;
      pnVar28 = (this->thePvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar34 = lVar32 * 0x38;
      local_88.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = pnVar28[lVar32].m_backend.exp;
      local_88.neg = pnVar28[lVar32].m_backend.neg;
      local_88.fpclass = pnVar28[lVar32].m_backend.fpclass;
      local_88.prec_elem = pnVar28[lVar32].m_backend.prec_elem;
      local_c8.fpclass = cpp_dec_float_finite;
      local_c8.prec_elem = 10;
      local_c8.data._M_elems[0] = 0;
      local_c8.data._M_elems[1] = 0;
      local_c8.data._M_elems[2] = 0;
      local_c8.data._M_elems[3] = 0;
      local_c8.data._M_elems[4] = 0;
      local_c8.data._M_elems[5] = 0;
      local_c8.data._M_elems._24_5_ = 0;
      local_c8.data._M_elems[7]._1_3_ = 0;
      local_c8.data._M_elems._32_5_ = 0;
      local_c8.data._M_elems[9]._1_3_ = 0;
      local_c8.exp = 0;
      local_c8.neg = false;
      if (&local_c8 == &leaveMax->m_backend) {
        leaveMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_88;
      }
      else {
        local_c8.data._M_elems._32_5_ = local_88.data._M_elems._32_5_;
        local_c8.data._M_elems[9]._1_3_ = local_88.data._M_elems[9]._1_3_;
        local_c8.data._M_elems._24_5_ = local_88.data._M_elems._24_5_;
        local_c8.data._M_elems[7]._1_3_ = local_88.data._M_elems[7]._1_3_;
        local_c8.prec_elem = local_88.prec_elem;
        local_c8.fpclass = local_88.fpclass;
        local_c8.data._M_elems._0_8_ = local_88.data._M_elems._0_8_;
        local_c8.data._M_elems._8_8_ = local_88.data._M_elems._8_8_;
        local_c8.data._M_elems._16_8_ = local_88.data._M_elems._16_8_;
        local_c8.exp = local_88.exp;
        local_c8.neg = local_88.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_c8,&leaveMax->m_backend);
      if (local_c8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_108,0,(type *)0x0);
        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_c8,&local_108);
        lVar31 = 0x9e0;
        if (0 < iVar25) goto LAB_002413a0;
      }
      lVar31 = 0x9f8;
LAB_002413a0:
      lVar31 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar31);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
           *(undefined8 *)(lVar31 + 0x20 + lVar34);
      uVar13 = *(undefined8 *)(lVar31 + lVar34);
      uVar21 = ((undefined8 *)(lVar31 + lVar34))[1];
      puVar30 = (undefined8 *)(lVar31 + 0x10 + lVar34);
      uVar22 = puVar30[1];
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *puVar30;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
      (newCoPrhs->m_backend).exp = *(int *)(lVar31 + 0x28 + lVar34);
      (newCoPrhs->m_backend).neg = *(bool *)(lVar31 + 0x2c + lVar34);
      uVar13 = *(undefined8 *)(lVar31 + 0x30 + lVar34);
      (newCoPrhs->m_backend).fpclass = (int)uVar13;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar21;
      (newUBbound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar24;
      pnVar28 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar21;
      (newLBbound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar24;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterBound->m_backend,0);
      return;
    }
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
    uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
    uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
    uVar22 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(enterBound->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 2) = uVar21;
    (enterBound->m_backend).exp = pnVar28[lVar32].m_backend.exp;
    (enterBound->m_backend).neg = pnVar28[lVar32].m_backend.neg;
    iVar24 = pnVar28[lVar32].m_backend.prec_elem;
    (enterBound->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
    (enterBound->m_backend).prec_elem = iVar24;
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    if ((&local_108 != &enterBound->m_backend) &&
       (pcVar33 = &enterBound->m_backend, &local_108 != &newCoPrhs->m_backend)) {
      uVar13 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8);
      local_108.data._M_elems[8] = (uint)uVar13;
      local_108.data._M_elems[9] = (uint)((ulong)uVar13 >> 0x20);
      local_108.data._M_elems._0_8_ = *(undefined8 *)(newCoPrhs->m_backend).data._M_elems;
      local_108.data._M_elems._8_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2);
      local_108.data._M_elems._16_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4);
      uVar13 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6);
      local_108.data._M_elems._24_5_ = SUB85(uVar13,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
      local_108.exp = (newCoPrhs->m_backend).exp;
      local_108.neg = (newCoPrhs->m_backend).neg;
      local_108.fpclass = (newCoPrhs->m_backend).fpclass;
      local_108.prec_elem = (newCoPrhs->m_backend).prec_elem;
      pcVar33 = &enterBound->m_backend;
    }
    goto LAB_00241189;
  }
  SPxRowId::SPxRowId((SPxRowId *)&local_108,(SPxId *)&local_50);
  iVar25 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set,(DataKey *)&local_108);
  lVar32 = (long)iVar25;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[lVar32]) {
  case D_FREE:
    pnVar28 = (this->thePvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar34 = lVar32 * 0x38;
    local_88.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
    local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
    local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
    local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_88.exp = pnVar28[lVar32].m_backend.exp;
    local_88.neg = pnVar28[lVar32].m_backend.neg;
    local_88.fpclass = pnVar28[lVar32].m_backend.fpclass;
    local_88.prec_elem = pnVar28[lVar32].m_backend.prec_elem;
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems._24_5_ = 0;
    local_c8.data._M_elems[7]._1_3_ = 0;
    local_c8.data._M_elems._32_5_ = 0;
    local_c8.data._M_elems[9]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    if (&local_c8 == &leaveMax->m_backend) {
      leaveMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_88;
    }
    else {
      local_c8.data._M_elems._32_5_ = local_88.data._M_elems._32_5_;
      local_c8.data._M_elems[9]._1_3_ = local_88.data._M_elems[9]._1_3_;
      local_c8.data._M_elems._24_5_ = local_88.data._M_elems._24_5_;
      local_c8.data._M_elems[7]._1_3_ = local_88.data._M_elems[7]._1_3_;
      local_c8.prec_elem = local_88.prec_elem;
      local_c8.fpclass = local_88.fpclass;
      local_c8.data._M_elems._0_8_ = local_88.data._M_elems._0_8_;
      local_c8.data._M_elems._8_8_ = local_88.data._M_elems._8_8_;
      local_c8.data._M_elems._16_8_ = local_88.data._M_elems._16_8_;
      local_c8.exp = local_88.exp;
      local_c8.neg = local_88.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_c8,&leaveMax->m_backend);
    if (local_c8.fpclass == cpp_dec_float_NaN) {
LAB_002411f5:
      lVar31 = 0x9b0;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_108,0,(type *)0x0);
      iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_c8,&local_108);
      if (-1 < iVar25) goto LAB_002411f5;
      lVar31 = 0x9c8;
    }
    lVar31 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar31);
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
         *(undefined8 *)(lVar31 + 0x20 + lVar34);
    uVar13 = *(undefined8 *)(lVar31 + lVar34);
    uVar21 = ((undefined8 *)(lVar31 + lVar34))[1];
    puVar30 = (undefined8 *)(lVar31 + 0x10 + lVar34);
    uVar22 = puVar30[1];
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *puVar30;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
    (newCoPrhs->m_backend).exp = *(int *)(lVar31 + 0x28 + lVar34);
    (newCoPrhs->m_backend).neg = *(bool *)(lVar31 + 0x2c + lVar34);
    uVar13 = *(undefined8 *)(lVar31 + 0x30 + lVar34);
    (newCoPrhs->m_backend).fpclass = (int)uVar13;
    (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
    ::soplex::infinity::__tls_init();
    local_48 = *(double *)(in_FS_OFFSET + -8);
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    uStack_40 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,local_48);
    *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
         CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
         CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
    (newUBbound->m_backend).exp = local_108.exp;
    (newUBbound->m_backend).neg = local_108.neg;
    (newUBbound->m_backend).fpclass = local_108.fpclass;
    (newUBbound->m_backend).prec_elem = local_108.prec_elem;
    ::soplex::infinity::__tls_init();
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,-local_48);
    *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
    *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
         CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
    *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
         CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
    (newLBbound->m_backend).exp = local_108.exp;
    (newLBbound->m_backend).neg = local_108.neg;
    (newLBbound->m_backend).fpclass = local_108.fpclass;
    (newLBbound->m_backend).prec_elem = local_108.prec_elem;
    pSVar27 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data;
LAB_0024132d:
    pSVar27[lVar32] = P_FIXED;
    return;
  case D_ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&newUBbound->m_backend,0);
    ::soplex::infinity::__tls_init();
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,-*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
    *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
         CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
    *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
         CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
    (newLBbound->m_backend).exp = local_108.exp;
    (newLBbound->m_backend).neg = local_108.neg;
    (newLBbound->m_backend).fpclass = local_108.fpclass;
    (newLBbound->m_backend).prec_elem = local_108.prec_elem;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar32] = P_ON_LOWER;
    pnVar28 = (this->theLRbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_00240683;
  case D_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
         CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
         CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
    (newUBbound->m_backend).exp = local_108.exp;
    (newUBbound->m_backend).neg = local_108.neg;
    (newUBbound->m_backend).fpclass = local_108.fpclass;
    (newUBbound->m_backend).prec_elem = local_108.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&newLBbound->m_backend,0);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar32] = P_ON_UPPER;
    pnVar28 = (this->theURbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_00240839;
  case D_ON_BOTH:
    pnVar28 = (this->thePvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar34 = lVar32 * 0x38;
    local_88.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
    local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
    local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
    local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_88.exp = pnVar28[lVar32].m_backend.exp;
    local_88.neg = pnVar28[lVar32].m_backend.neg;
    local_88.fpclass = pnVar28[lVar32].m_backend.fpclass;
    local_88.prec_elem = pnVar28[lVar32].m_backend.prec_elem;
    local_c8.fpclass = cpp_dec_float_finite;
    local_c8.prec_elem = 10;
    local_c8.data._M_elems[0] = 0;
    local_c8.data._M_elems[1] = 0;
    local_c8.data._M_elems[2] = 0;
    local_c8.data._M_elems[3] = 0;
    local_c8.data._M_elems[4] = 0;
    local_c8.data._M_elems[5] = 0;
    local_c8.data._M_elems._24_5_ = 0;
    local_c8.data._M_elems[7]._1_3_ = 0;
    local_c8.data._M_elems._32_5_ = 0;
    local_c8.data._M_elems[9]._1_3_ = 0;
    local_c8.exp = 0;
    local_c8.neg = false;
    if (&local_c8 != &leaveMax->m_backend) {
      uVar13 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 8);
      local_c8.data._M_elems._32_5_ = SUB85(uVar13,0);
      local_c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
      local_c8.data._M_elems._0_8_ = *(undefined8 *)(leaveMax->m_backend).data._M_elems;
      local_c8.data._M_elems._8_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 2);
      local_c8.data._M_elems._16_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 4);
      uVar13 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 6);
      local_c8.data._M_elems._24_5_ = SUB85(uVar13,0);
      local_c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
      local_c8.exp = (leaveMax->m_backend).exp;
      local_c8.neg = (leaveMax->m_backend).neg;
      local_c8.fpclass = (leaveMax->m_backend).fpclass;
      local_c8.prec_elem = (leaveMax->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_c8,&local_88);
    if (local_c8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_108,0,(type *)0x0);
      iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_c8,&local_108);
      if (iVar25 < 0) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&newUBbound->m_backend,0);
        ::soplex::infinity::__tls_init();
        local_108.fpclass = cpp_dec_float_finite;
        local_108.prec_elem = 10;
        local_108.data._M_elems[0] = 0;
        local_108.data._M_elems[1] = 0;
        local_108.data._M_elems[2] = 0;
        local_108.data._M_elems[3] = 0;
        local_108.data._M_elems[4] = 0;
        local_108.data._M_elems[5] = 0;
        local_108.data._M_elems._24_5_ = 0;
        local_108.data._M_elems[7]._1_3_ = 0;
        local_108.data._M_elems[8] = 0;
        local_108.data._M_elems[9] = 0;
        local_108.exp = 0;
        local_108.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_108,-*(double *)(in_FS_OFFSET + -8));
        *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
        *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
        *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
        *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
             CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
        *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
             CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
        (newLBbound->m_backend).exp = local_108.exp;
        (newLBbound->m_backend).neg = local_108.neg;
        (newLBbound->m_backend).fpclass = local_108.fpclass;
        (newLBbound->m_backend).prec_elem = local_108.prec_elem;
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.rowstat.data[lVar32] = P_ON_LOWER;
        pnVar28 = (this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_002415a7;
      }
    }
    ::soplex::infinity::__tls_init();
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_108.data._M_elems._0_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_108.data._M_elems._8_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_108.data._M_elems._16_8_;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
         CONCAT35(local_108.data._M_elems[7]._1_3_,local_108.data._M_elems._24_5_);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
         CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
    (newUBbound->m_backend).exp = local_108.exp;
    (newUBbound->m_backend).neg = local_108.neg;
    (newUBbound->m_backend).fpclass = local_108.fpclass;
    (newUBbound->m_backend).prec_elem = local_108.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&newLBbound->m_backend,0);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar32] = P_ON_UPPER;
    pnVar28 = (this->theURbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_00240f13;
  case P_FIXED:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE54 ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR! Tried to put a fixed row variable into the basis: ",
               0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
    poVar29 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar29,", lhs=",6);
    poVar29 = boost::multiprecision::operator<<
                        (poVar29,(this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .left.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar29,", rhs=",6);
    poVar29 = boost::multiprecision::operator<<
                        (poVar29,(this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .right.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar32);
    std::endl<char,std::char_traits<char>>(poVar29);
    puVar30 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_108.data._M_elems._0_8_ = local_108.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"XLEAVE05 This should never happen.","");
    *puVar30 = &PTR__SPxException_0069d438;
    puVar30[1] = puVar30 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar30 + 1),local_108.data._M_elems._0_8_,
               local_108.data._M_elems._0_8_ + local_108.data._M_elems._8_8_);
    *puVar30 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar30,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    puVar30 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_108.data._M_elems._0_8_ = local_108.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"XLEAVE06 This should never happen.","");
    *puVar30 = &PTR__SPxException_0069d438;
    puVar30[1] = puVar30 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar30 + 1),local_108.data._M_elems._0_8_,
               local_108.data._M_elems._0_8_ + local_108.data._M_elems._8_8_);
    *puVar30 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar30,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    SVar26 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(this_00,iVar25);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar32] = SVar26;
    pcVar35 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend;
    ::soplex::infinity::__tls_init();
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,*(double *)(in_FS_OFFSET + -8));
    if (((pcVar35->fpclass != cpp_dec_float_NaN) && (local_108.fpclass != cpp_dec_float_NaN)) &&
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (pcVar35,&local_108), iVar25 < 0)) {
      pnVar28 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar14 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 0x20) =
           *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar14[lVar32].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar22;
      *(undefined8 *)&pnVar14[lVar32].m_backend.data = uVar13;
      *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 8) = uVar21;
      pnVar14[lVar32].m_backend.exp = pnVar28[lVar32].m_backend.exp;
      pnVar14[lVar32].m_backend.neg = pnVar28[lVar32].m_backend.neg;
      iVar24 = pnVar28[lVar32].m_backend.prec_elem;
      pnVar14[lVar32].m_backend.fpclass = pnVar28[lVar32].m_backend.fpclass;
      pnVar14[lVar32].m_backend.prec_elem = iVar24;
    }
    pnVar28 = (this->theURbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
    uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
    uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
    uVar22 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
    (newCoPrhs->m_backend).exp = pnVar28[lVar32].m_backend.exp;
    (newCoPrhs->m_backend).neg = pnVar28[lVar32].m_backend.neg;
    iVar24 = pnVar28[lVar32].m_backend.prec_elem;
    (newCoPrhs->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
    (newCoPrhs->m_backend).prec_elem = iVar24;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar28[lVar32].m_backend.data._M_elems[0];
    uVar6 = *(uint *)((long)&pnVar28[lVar32].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x14);
    uVar13 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 4);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    iVar25 = pnVar28[lVar32].m_backend.exp;
    uVar10 = pnVar28[lVar32].m_backend.fpclass;
    uVar18 = pnVar28[lVar32].m_backend.prec_elem;
    bVar4 = pnVar28[lVar32].m_backend.neg;
    (newLBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar22;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar23;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar13;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar21;
    (newLBbound->m_backend).data._M_elems[9] = uVar6;
    (newLBbound->m_backend).exp = iVar25;
    (newLBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar10 != 0) ^ bVar4);
    (newLBbound->m_backend).fpclass = uVar10;
    (newLBbound->m_backend).prec_elem = uVar18;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar28[lVar32].m_backend.data._M_elems[0];
    uVar6 = *(uint *)((long)&pnVar28[lVar32].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x14);
    uVar13 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 4);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    uVar11 = pnVar28[lVar32].m_backend.fpclass;
    uVar19 = pnVar28[lVar32].m_backend.prec_elem;
    bVar4 = pnVar28[lVar32].m_backend.neg;
    iVar25 = pnVar28[lVar32].m_backend.exp;
    (newUBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar22;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar23;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar13;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar21;
    (newUBbound->m_backend).data._M_elems[9] = uVar6;
    (newUBbound->m_backend).exp = iVar25;
    (newUBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar11 != 0) ^ bVar4);
    (newUBbound->m_backend).fpclass = uVar11;
    (newUBbound->m_backend).prec_elem = uVar19;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar28[lVar32].m_backend.data._M_elems[0];
    uVar6 = *(uint *)((long)&pnVar28[lVar32].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x14);
    uVar13 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 4);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    iVar25 = pnVar28[lVar32].m_backend.exp;
    uVar12 = pnVar28[lVar32].m_backend.fpclass;
    uVar20 = pnVar28[lVar32].m_backend.prec_elem;
    bVar4 = pnVar28[lVar32].m_backend.neg;
    (enterBound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar22;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar23;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar13;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar21;
    (enterBound->m_backend).data._M_elems[9] = uVar6;
    (enterBound->m_backend).exp = iVar25;
    (enterBound->m_backend).neg = (bool)((uVar5 != 0 || uVar12 != 0) ^ bVar4);
    (enterBound->m_backend).fpclass = uVar12;
    (enterBound->m_backend).prec_elem = uVar20;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    SVar26 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(this_00,iVar25);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar32] = SVar26;
    pcVar35 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar32].m_backend;
    ::soplex::infinity::__tls_init();
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems._24_5_ = 0;
    local_108.data._M_elems[7]._1_3_ = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_108,-*(double *)(in_FS_OFFSET + -8));
    if (((pcVar35->fpclass != cpp_dec_float_NaN) && (local_108.fpclass != cpp_dec_float_NaN)) &&
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (pcVar35,&local_108), 0 < iVar25)) {
      pnVar28 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar14 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20) =
           *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 0x20);
      uVar13 = *(undefined8 *)&pnVar14[lVar32].m_backend.data;
      uVar21 = *(undefined8 *)((long)&pnVar14[lVar32].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar14[lVar32].m_backend.data + 0x10);
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar22;
      *(undefined8 *)&pnVar28[lVar32].m_backend.data = uVar13;
      *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8) = uVar21;
      pnVar28[lVar32].m_backend.exp = pnVar14[lVar32].m_backend.exp;
      pnVar28[lVar32].m_backend.neg = pnVar14[lVar32].m_backend.neg;
      iVar24 = pnVar14[lVar32].m_backend.prec_elem;
      pnVar28[lVar32].m_backend.fpclass = pnVar14[lVar32].m_backend.fpclass;
      pnVar28[lVar32].m_backend.prec_elem = iVar24;
    }
    pnVar28 = (this->theLRbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 0x20);
    uVar13 = *(undefined8 *)&pnVar28[lVar32].m_backend.data;
    uVar21 = *(undefined8 *)((long)&pnVar28[lVar32].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x10);
    uVar22 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar21;
    (newCoPrhs->m_backend).exp = pnVar28[lVar32].m_backend.exp;
    (newCoPrhs->m_backend).neg = pnVar28[lVar32].m_backend.neg;
    iVar24 = pnVar28[lVar32].m_backend.prec_elem;
    (newCoPrhs->m_backend).fpclass = pnVar28[lVar32].m_backend.fpclass;
    (newCoPrhs->m_backend).prec_elem = iVar24;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar28[lVar32].m_backend.data._M_elems[0];
    uVar6 = *(uint *)((long)&pnVar28[lVar32].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x14);
    uVar13 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 4);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    iVar25 = pnVar28[lVar32].m_backend.exp;
    uVar7 = pnVar28[lVar32].m_backend.fpclass;
    uVar15 = pnVar28[lVar32].m_backend.prec_elem;
    bVar4 = pnVar28[lVar32].m_backend.neg;
    (newUBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar22;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar23;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar13;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar21;
    (newUBbound->m_backend).data._M_elems[9] = uVar6;
    (newUBbound->m_backend).exp = iVar25;
    (newUBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar7 != 0) ^ bVar4);
    (newUBbound->m_backend).fpclass = uVar7;
    (newUBbound->m_backend).prec_elem = uVar15;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar28[lVar32].m_backend.data._M_elems[0];
    uVar6 = *(uint *)((long)&pnVar28[lVar32].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x14);
    uVar13 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 4);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    uVar8 = pnVar28[lVar32].m_backend.fpclass;
    uVar16 = pnVar28[lVar32].m_backend.prec_elem;
    bVar4 = pnVar28[lVar32].m_backend.neg;
    iVar25 = pnVar28[lVar32].m_backend.exp;
    (newLBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar22;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar23;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar13;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar21;
    (newLBbound->m_backend).data._M_elems[9] = uVar6;
    (newLBbound->m_backend).exp = iVar25;
    (newLBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar8 != 0) ^ bVar4);
    (newLBbound->m_backend).fpclass = uVar8;
    (newLBbound->m_backend).prec_elem = uVar16;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar28[lVar32].m_backend.data._M_elems[0];
    uVar6 = *(uint *)((long)&pnVar28[lVar32].m_backend.data + 0x24);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 0x14);
    uVar13 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar28[lVar32].m_backend.data + 4);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    iVar25 = pnVar28[lVar32].m_backend.exp;
    uVar9 = pnVar28[lVar32].m_backend.fpclass;
    uVar17 = pnVar28[lVar32].m_backend.prec_elem;
    bVar4 = pnVar28[lVar32].m_backend.neg;
    (enterBound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar22;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar23;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar13;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar21;
    (enterBound->m_backend).data._M_elems[9] = uVar6;
    (enterBound->m_backend).exp = iVar25;
    (enterBound->m_backend).neg = (bool)((uVar5 != 0 || uVar9 != 0) ^ bVar4);
    (enterBound->m_backend).fpclass = uVar9;
    (enterBound->m_backend).prec_elem = uVar17;
    pnVar28 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    puVar30 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_108.data._M_elems._0_8_ = local_108.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"XLEAVE04 This should never happen.","");
    *puVar30 = &PTR__SPxException_0069d438;
    puVar30[1] = puVar30 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar30 + 1),local_108.data._M_elems._0_8_,
               local_108.data._M_elems._0_8_ + local_108.data._M_elems._8_8_);
    *puVar30 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar30,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pcVar35 = (cpp_dec_float<50U,_int,_void> *)((long)pnVar28 + lVar32 * 0x38);
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems._24_5_ = 0;
  local_108.data._M_elems[7]._1_3_ = 0;
  local_108.data._M_elems[8] = 0;
  local_108.data._M_elems[9] = 0;
  local_108.exp = 0;
  local_108.neg = false;
  if ((&local_108 != pcVar35) && (pcVar33 = pcVar35, &local_108 != &newCoPrhs->m_backend)) {
    uVar13 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8);
    local_108.data._M_elems[8] = (uint)uVar13;
    local_108.data._M_elems[9] = (uint)((ulong)uVar13 >> 0x20);
    local_108.data._M_elems._0_8_ = *(undefined8 *)(newCoPrhs->m_backend).data._M_elems;
    local_108.data._M_elems._8_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2);
    local_108.data._M_elems._16_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4);
    uVar13 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6);
    local_108.data._M_elems._24_5_ = SUB85(uVar13,0);
    local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
    local_108.exp = (newCoPrhs->m_backend).exp;
    local_108.neg = (newCoPrhs->m_backend).neg;
    local_108.fpclass = (newCoPrhs->m_backend).fpclass;
    local_108.prec_elem = (newCoPrhs->m_backend).prec_elem;
  }
LAB_00241189:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_108,pcVar33);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)objChange,&local_108);
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}